

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_write_tile_chunk
          (exr_context_t ctxt,int part_index,int tilex,int tiley,int levelx,int levely,
          void *packed_data,uint64_t packed_size)

{
  undefined8 unaff_RBX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  _internal_exr_part *unaff_retaddr;
  int in_stack_0000000c;
  _internal_exr_context *in_stack_00000010;
  int in_stack_00000030;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  int in_stack_fffffffffffffff4;
  exr_result_t eVar1;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar1 = 2;
  }
  else {
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar1 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if (in_RDI->parts[(int)in_ESI]->storage_mode == EXR_STORAGE_DEEP_TILED) {
      internal_exr_unlock(in_RDI);
      eVar1 = (*in_RDI->standard_error)(in_RDI,0x1b);
    }
    else {
      eVar1 = write_tile_chunk(in_stack_00000010,in_stack_0000000c,unaff_retaddr,
                               (int)((ulong)unaff_RBX >> 0x20),(int)unaff_RBX,
                               in_stack_fffffffffffffff4,in_stack_00000030,part,(uint64_t)pctxt,
                               CONCAT44(levely,rv),(void *)CONCAT44(tiley,levelx),
                               CONCAT44(part_index,tilex));
      internal_exr_unlock(in_RDI);
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_write_tile_chunk (
    exr_context_t ctxt,
    int           part_index,
    int           tilex,
    int           tiley,
    int           levelx,
    int           levely,
    const void*   packed_data,
    uint64_t      packed_size)
{
    exr_result_t rv;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (part->storage_mode == EXR_STORAGE_DEEP_TILED)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_USE_TILE_DEEP_WRITE));

    rv = write_tile_chunk (
        pctxt,
        part_index,
        part,
        tilex,
        tiley,
        levelx,
        levely,
        packed_data,
        packed_size,
        0,
        NULL,
        0);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}